

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void poly1305_feed_chunk(poly1305 *ctx,uchar *chunk,int len)

{
  undefined1 local_38 [8];
  bigval c;
  int len_local;
  uchar *chunk_local;
  poly1305 *ctx_local;
  
  c.w[2]._4_4_ = len;
  bigval_import_le((bigval *)local_38,chunk,len);
  c.w[(long)(c.w[2]._4_4_ / 8) + -1] =
       1L << ((byte)(c.w[2]._4_4_ % 8 << 3) & 0x3f) | c.w[(long)(c.w[2]._4_4_ / 8) + -1];
  bigval_add((bigval *)local_38,(bigval *)local_38,&ctx->h);
  bigval_mul_mod_p(&ctx->h,(bigval *)local_38,&ctx->r);
  return;
}

Assistant:

static void poly1305_feed_chunk(struct poly1305 *ctx,
                                const unsigned char *chunk, int len)
{
    bigval c;
    bigval_import_le(&c, chunk, len);
    c.w[len / BIGNUM_INT_BYTES] |=
        (BignumInt)1 << (8 * (len % BIGNUM_INT_BYTES));
    bigval_add(&c, &c, &ctx->h);
    bigval_mul_mod_p(&ctx->h, &c, &ctx->r);
}